

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2610_write_pcmromb(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  YM2610 *F2610;
  
  uVar1 = *(uint *)((long)chip + 0x5390);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)chip + 0x5370)),data,__n);
  return;
}

Assistant:

void ym2610_write_pcmromb(void* chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	YM2610 *F2610 = (YM2610 *)chip;
	
	if (offset > F2610->deltaT.memory_size)
		return;
	if (offset + length > F2610->deltaT.memory_size)
		length = F2610->deltaT.memory_size - offset;
	
	memcpy(F2610->deltaT.memory + offset, data, length);
	
	return;
}